

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseIntegerLiteral
                 (char *in,char *end,Value **integer,ValueType integerType)

{
  byte bVar1;
  byte *pbVar2;
  longlong value;
  ulonglong value_00;
  Value *this;
  byte *pbVar3;
  byte *__nptr;
  
  *integer = (Value *)0x0;
  if (7 < (uint)(integerType + ddl_none) || (in == end || in == (char *)0x0)) {
    return in;
  }
  do {
    pbVar2 = (byte *)in;
    pbVar3 = (byte *)in;
    __nptr = (byte *)in;
    if ((0x2c < (ulong)(byte)*in) ||
       (pbVar3 = (byte *)in, (0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0)) break;
    in = (char *)((byte *)in + 1);
    pbVar2 = (byte *)end;
    pbVar3 = (byte *)end;
    __nptr = (byte *)end;
  } while (in != end);
  do {
    if (pbVar2 == (byte *)end) {
LAB_0060f7f4:
      if (9 < (byte)(*__nptr - 0x30)) {
        return (char *)pbVar3;
      }
      value = atoll((char *)__nptr);
      value_00 = strtoull((char *)__nptr,(char **)0x0,10);
      this = ValueAllocator::allocPrimData(integerType,1);
      *integer = this;
      switch(integerType + ddl_none) {
      case ddl_bool:
        Value::setInt8(this,(int8)value);
        return (char *)pbVar3;
      case ddl_int8:
        Value::setInt16(this,(int16)value);
        return (char *)pbVar3;
      case ddl_int16:
        Value::setInt32(this,(int32)value);
        return (char *)pbVar3;
      case ddl_int32:
        Value::setInt64(this,value);
        return (char *)pbVar3;
      case ddl_int64:
        Value::setUnsignedInt8(this,(uint8)value_00);
        return (char *)pbVar3;
      case ddl_unsigned_int8:
        Value::setUnsignedInt16(this,(uint16)value_00);
        return (char *)pbVar3;
      case ddl_unsigned_int16:
        Value::setUnsignedInt32(this,(uint32)value_00);
        return (char *)pbVar3;
      case ddl_unsigned_int32:
        Value::setUnsignedInt64(this,value_00);
        return (char *)pbVar3;
      default:
        return (char *)pbVar3;
      }
    }
    bVar1 = *pbVar2;
    pbVar3 = pbVar2;
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    goto LAB_0060f7f4;
    pbVar2 = pbVar2 + 1;
    pbVar3 = (byte *)end;
  } while( true );
}

Assistant:

char *OpenDDLParser::parseIntegerLiteral( char *in, char *end, Value **integer, Value::ValueType integerType ) {
    *integer = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    if( !(isIntegerType( integerType ) || isUnsignedIntegerType(integerType)) ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    if( isNumeric( *start ) ) {
#ifdef OPENDDL_NO_USE_CPP11
        const int64 value( atol( start ) ); // maybe not really 64bit as atoll is but exists without c++11
        const uint64 uvalue( strtoul( start,ddl_nullptr,10 ) );
#else
        const int64 value( atoll( start ) );
        const uint64 uvalue( strtoull( start,ddl_nullptr,10 ) );
#endif
        *integer = ValueAllocator::allocPrimData( integerType );
        switch( integerType ) {
            case Value::ddl_int8:
                ( *integer )->setInt8( (int8) value );
                break;
            case Value::ddl_int16:
                ( *integer )->setInt16( ( int16 ) value );
                break;
            case Value::ddl_int32:
                ( *integer )->setInt32( ( int32 ) value );
                break;
            case Value::ddl_int64:
                ( *integer )->setInt64( ( int64 ) value );
                break;
            case Value::ddl_unsigned_int8:
                ( *integer )->setUnsignedInt8( (uint8) uvalue );
                break;
            case Value::ddl_unsigned_int16:
                ( *integer )->setUnsignedInt16( ( uint16 ) uvalue );
                break;
            case Value::ddl_unsigned_int32:
                ( *integer )->setUnsignedInt32( ( uint32 ) uvalue );
                break;
            case Value::ddl_unsigned_int64:
                ( *integer )->setUnsignedInt64( ( uint64 ) uvalue );
                break;
            default:
                break;
        }
    }

    return in;
}